

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QWizardDefaultProperty>::emplace<QWizardDefaultProperty>
          (QMovableArrayOps<QWizardDefaultProperty> *this,qsizetype i,QWizardDefaultProperty *args)

{
  QWizardDefaultProperty **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_a0;
  QWizardDefaultProperty tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
           super_QArrayDataPointer<QWizardDefaultProperty>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QWizardDefaultProperty>).
        super_QArrayDataPointer<QWizardDefaultProperty>.size == i) {
      qVar5 = QArrayDataPointer<QWizardDefaultProperty>::freeSpaceAtEnd
                        ((QArrayDataPointer<QWizardDefaultProperty> *)this);
      if (qVar5 == 0) goto LAB_004c799f;
      QWizardDefaultProperty::QWizardDefaultProperty
                ((this->super_QGenericArrayOps<QWizardDefaultProperty>).
                 super_QArrayDataPointer<QWizardDefaultProperty>.ptr +
                 (this->super_QGenericArrayOps<QWizardDefaultProperty>).
                 super_QArrayDataPointer<QWizardDefaultProperty>.size,args);
LAB_004c7aa6:
      pqVar2 = &(this->super_QGenericArrayOps<QWizardDefaultProperty>).
                super_QArrayDataPointer<QWizardDefaultProperty>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004c7a5f;
    }
LAB_004c799f:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QWizardDefaultProperty>::freeSpaceAtBegin
                        ((QArrayDataPointer<QWizardDefaultProperty> *)this);
      if (qVar5 != 0) {
        QWizardDefaultProperty::QWizardDefaultProperty
                  ((this->super_QGenericArrayOps<QWizardDefaultProperty>).
                   super_QArrayDataPointer<QWizardDefaultProperty>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QWizardDefaultProperty>).
                   super_QArrayDataPointer<QWizardDefaultProperty>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_004c7aa6;
      }
    }
  }
  tmp.changedSignal.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.changedSignal.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.changedSignal.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  tmp.property.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  tmp.property.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.className.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.property.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.className.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.className.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QWizardDefaultProperty::QWizardDefaultProperty(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QWizardDefaultProperty>).
          super_QArrayDataPointer<QWizardDefaultProperty>.size != 0;
  QArrayDataPointer<QWizardDefaultProperty>::detachAndGrow
            ((QArrayDataPointer<QWizardDefaultProperty> *)this,(uint)(i == 0 && bVar6),1,
             (QWizardDefaultProperty **)0x0,(QArrayDataPointer<QWizardDefaultProperty> *)0x0);
  if (i == 0 && bVar6) {
    QWizardDefaultProperty::QWizardDefaultProperty
              ((this->super_QGenericArrayOps<QWizardDefaultProperty>).
               super_QArrayDataPointer<QWizardDefaultProperty>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QWizardDefaultProperty>).
               super_QArrayDataPointer<QWizardDefaultProperty>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QWizardDefaultProperty>).
              super_QArrayDataPointer<QWizardDefaultProperty>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_a0,(QArrayDataPointer<QWizardDefaultProperty> *)this,i,1);
    QWizardDefaultProperty::QWizardDefaultProperty(local_a0.displaceFrom,&tmp);
    local_a0.displaceFrom = local_a0.displaceFrom + 1;
    (local_a0.data)->size = (local_a0.data)->size + local_a0.nInserts;
  }
  QWizardDefaultProperty::~QWizardDefaultProperty(&tmp);
LAB_004c7a5f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }